

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkHaigCollectMembers(Hop_Man_t *p)

{
  Vec_Ptr_t *p_00;
  Hop_Obj_t *pObj;
  Hop_Obj_t *pHVar1;
  int i;
  
  p_00 = Vec_PtrAlloc(0x1002);
  for (i = 0; i < p->vObjs->nSize; i = i + 1) {
    pObj = (Hop_Obj_t *)Vec_PtrEntry(p->vObjs,i);
    if ((pObj->field_0).pData != (void *)0x0) {
      pHVar1 = Hop_ObjRepr(pObj);
      (pObj->field_0).pData = pHVar1;
      Vec_PtrPush(p_00,pObj);
    }
  }
  return p_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Collects the nodes in the classes.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Ptr_t * Abc_NtkHaigCollectMembers( Hop_Man_t * p )
{
    Vec_Ptr_t * vObjs;
    Hop_Obj_t * pObj;
    int i;
    vObjs = Vec_PtrAlloc( 4098 );
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( pObj->pData == NULL )
            continue;
        pObj->pData = Hop_ObjRepr( pObj );
        Vec_PtrPush( vObjs, pObj );
    }
    return vObjs;
}